

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O3

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndexedIndirectParams>
::DrawTestCase(DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndexedIndirectParams> *this,
              TestContext *context,char *name,char *desc,DrawIndexedIndirectParams *data)

{
  allocator<char> local_71;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,name,&local_71);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"vkCmdDrawIndexedIndirect testcase.","");
  tcu::TestCase::TestCase((TestCase *)this,context,(char *)local_50[0],(char *)local_70[0]);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00cec1f0;
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DrawTestCase_00cfd0e0;
  std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>::
  vector((vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_> *)
         &this->m_data,
         (vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_> *)
         desc);
  (this->m_data).super_DrawParamsBase.topology = *(VkPrimitiveTopology *)(desc + 0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&(this->m_data).super_IndexedParamsBase.indexes,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(desc + 0x20));
  (this->m_data).super_IndexedParamsBase.indexType = *(VkIndexType *)(desc + 0x38);
  std::vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>::
  vector(&(this->m_data).commands,
         (vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
          *)(desc + 0x40));
  (this->m_vertShaderSource)._M_dataplus._M_p = (pointer)&(this->m_vertShaderSource).field_2;
  (this->m_vertShaderSource)._M_string_length = 0;
  (this->m_vertShaderSource).field_2._M_local_buf[0] = '\0';
  (this->m_fragShaderSource)._M_dataplus._M_p = (pointer)&(this->m_fragShaderSource).field_2;
  (this->m_fragShaderSource)._M_string_length = 0;
  (this->m_fragShaderSource).field_2._M_local_buf[0] = '\0';
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(this);
  return;
}

Assistant:

DrawTestCase<T>::DrawTestCase (tcu::TestContext& context, const char* name, const char* desc, const T data)
	: vkt::TestCase	(context, name, desc)
	, m_data		(data)
{
	initShaderSources();
}